

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O0

void __thiscall visualOutput::takeValue(visualOutput *this)

{
  int iVar1;
  outputArrow *poVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  WINDOW *pWVar6;
  int local_38;
  int local_34;
  int x;
  int y;
  int val;
  visualOutput *this_local;
  
  poVar2 = (this->super_output).outArr;
  _y = this;
  iVar3 = (*(poVar2->super_arrowType)._vptr_arrowType[2])(poVar2,0xfffffffe);
  x = (int)(short)iVar3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->in,&x);
  if (x == -1) {
    std::vector<int,_std::allocator<int>_>::clear(&this->in);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->in);
  if (2 < sVar4) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->in,0);
    iVar3 = *pvVar5;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->in);
    if (((long)iVar3 + sVar4) - 3 < (ulong)(long)this->width) {
      flash();
      if (this->visualWin == (WINDOW *)0x0) {
        local_34 = -1;
      }
      else {
        local_34 = (int)this->visualWin->_begy;
      }
      if (this->visualWin == (WINDOW *)0x0) {
        local_38 = -1;
      }
      else {
        local_38 = (int)this->visualWin->_begx;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->in,1);
      iVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->in,0);
      iVar1 = *pvVar5;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->in);
      pWVar6 = (WINDOW *)newwin(1,1,iVar3 + local_34,iVar1 + (int)sVar4 + -3 + local_38);
      this->highlight = pWVar6;
      wbkgd(this->highlight,(x + 6U & 0xff) << 8);
      pWVar6 = this->highlight;
      sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->in);
      mvwprintw(pWVar6,local_34,local_38 + (int)sVar4 + -3," ");
      wrefresh(this->highlight);
      delwin(this->highlight);
    }
  }
  return;
}

Assistant:

void visualOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	in.push_back(val);

	if (val == -1)
		in.clear();

	if (in.size() > 2 && in[0] + in.size() - 3 < width) {
		flash();
		int y,x;
		getbegyx(visualWin, y, x);
		highlight = newwin(1, 1, in[1] + y, in[0] + in.size() - 3 + x);
		wbkgd(highlight, COLOR_PAIR(val + 6));
		mvwprintw(highlight, y, x + in.size() - 3, " ");
		wrefresh(highlight);
		delwin(highlight);
	}

	return;
}